

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::
str<kj::StringPtr&,char_const(&)[3],kj::StringPtr&,char_const(&)[7],kj::StringPtr&,char_const(&)[31]>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [3],
          StringPtr *params_2,char (*params_3) [7],StringPtr *params_4,char (*params_5) [31])

{
  ArrayPtr<const_char> *params_5_00;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  params_5_00 = *(ArrayPtr<const_char> **)this;
  local_40.size_ = strlen((char *)params);
  local_50.ptr = *(char **)params_1;
  local_50.size_ = *(long *)(params_1[2] + 2) - 1;
  local_40.ptr = (char *)params;
  local_60.size_ = strlen((char *)params_2);
  local_70.ptr = *(char **)params_3;
  local_70.size_ = *(long *)(params_3[1] + 1) - 1;
  local_60.ptr = (char *)params_2;
  local_80.size_ = strlen((char *)params_4);
  local_80.ptr = (char *)params_4;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&stack0xffffffffffffff70,&local_40,&local_50,&local_60,
             &local_70,&local_80,params_5_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}